

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

bool __thiscall
SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Remove
          (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *this,ArenaAllocator *allocator,
          Lifetime **data)

{
  bool bVar1;
  Type *ppLVar2;
  undefined1 local_40 [8];
  EditingIterator iter;
  Lifetime **data_local;
  ArenaAllocator *allocator_local;
  SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *this_local;
  
  iter.last = (NodeBase *)data;
  EditingIterator::EditingIterator((EditingIterator *)local_40,this);
  do {
    bVar1 = EditingIterator::Next((EditingIterator *)local_40);
    if (!bVar1) {
      return false;
    }
    ppLVar2 = Iterator::Data((Iterator *)local_40);
  } while (*ppLVar2 != (Type)(iter.last)->next);
  EditingIterator::RemoveCurrent((EditingIterator *)local_40,allocator);
  return true;
}

Assistant:

bool Remove(TAllocator * allocator, TData const& data)
    {
        EditingIterator iter(this);
        while (iter.Next())
        {
            if (iter.Data() == data)
            {
                iter.RemoveCurrent(allocator);
                return true;
            }
        }
        return false;
    }